

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_algo_struct.c
# Opt level: O2

void pl_computePhnHeur(mdef_t *md,ascr_t *a,pl_t *pl,int32 heutype,int32 win_strt,int32 win_efv)

{
  short sVar1;
  int32 *piVar2;
  s3senid_t *psVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  s3cipid_t *psVar9;
  int32 iVar10;
  uint uVar11;
  int iVar12;
  int32 **ppiVar13;
  int32 *piVar14;
  int iVar15;
  
  iVar12 = md->n_emit_state;
  piVar2 = pl->phn_heur_list;
  psVar3 = md->cd2cisen;
  for (uVar6 = 0; uVar6 == (uint)(int)psVar3[uVar6]; uVar6 = uVar6 + 1) {
    piVar2[md->sen2cimap[uVar6]] = 0;
  }
  if (heutype == 1) {
    for (lVar7 = (long)win_strt; lVar7 < win_efv; lVar7 = lVar7 + 1) {
      uVar11 = 0x80000000;
      for (uVar6 = 0; uVar6 == (uint)(int)psVar3[uVar6]; uVar6 = uVar6 + 1) {
        uVar5 = a->cache_ci_senscr[lVar7][uVar6];
        if (a->cache_ci_senscr[lVar7][uVar6] < (int)uVar11) {
          uVar5 = uVar11;
        }
        sVar1 = md->sen2cimap[uVar6];
        uVar11 = uVar5;
        if (sVar1 != md->sen2cimap[uVar6 + 1]) {
          iVar12 = piVar2[sVar1] + uVar5;
          uVar11 = 0x80000000;
          iVar10 = iVar12;
          if ((int)(piVar2[sVar1] & uVar5) < 0) {
            iVar10 = -0x80000000;
          }
          if (iVar12 < 1) {
            iVar10 = iVar12;
          }
          piVar2[sVar1] = iVar10;
        }
      }
    }
  }
  else if (heutype == 2) {
    for (lVar7 = (long)win_strt; lVar7 < win_efv; lVar7 = lVar7 + 1) {
      uVar11 = 0x80000000;
      for (uVar6 = 0; uVar6 == (uint)(int)psVar3[uVar6]; uVar6 = uVar6 + 1) {
        uVar5 = a->cache_ci_senscr[lVar7][uVar6] + uVar11;
        uVar4 = uVar5;
        if ((int)(a->cache_ci_senscr[lVar7][uVar6] & uVar11) < 0) {
          uVar4 = 0x80000000;
        }
        uVar11 = uVar4;
        if ((int)uVar5 < 1) {
          uVar11 = uVar5;
        }
        sVar1 = md->sen2cimap[uVar6];
        if (sVar1 != md->sen2cimap[uVar6 + 1]) {
          uVar5 = (int)uVar11 / iVar12;
          iVar8 = piVar2[sVar1] + uVar5;
          uVar11 = 0x80000000;
          iVar15 = iVar8;
          if ((int)(piVar2[sVar1] & uVar5) < 0) {
            iVar15 = -0x80000000;
          }
          if (iVar8 < 1) {
            iVar15 = iVar8;
          }
          piVar2[sVar1] = iVar15;
        }
      }
    }
  }
  else if (heutype == 3) {
    for (lVar7 = (long)win_strt; lVar7 < win_efv; lVar7 = lVar7 + 1) {
      uVar11 = 0x80000000;
      iVar12 = 0;
      for (uVar6 = 0; uVar6 == (uint)(int)psVar3[uVar6]; uVar6 = uVar6 + 1) {
        if (iVar12 == 0) {
          ppiVar13 = a->cache_ci_senscr;
          psVar9 = md->sen2cimap;
LAB_0010cd73:
          piVar14 = ppiVar13[lVar7];
          iVar8 = piVar2[iVar12] + piVar14[uVar6];
          iVar15 = -0x80000000;
          if (-1 < (piVar14[uVar6] & piVar2[iVar12])) {
            iVar15 = iVar8;
          }
          if (iVar8 < 1) {
            iVar15 = iVar8;
          }
          piVar2[iVar12] = iVar15;
        }
        else {
          psVar9 = md->sen2cimap;
          ppiVar13 = a->cache_ci_senscr;
          if (iVar12 != psVar9[uVar6 - 1]) goto LAB_0010cd73;
          piVar14 = ppiVar13[lVar7];
        }
        iVar12 = (int)psVar9[uVar6];
        uVar5 = piVar14[uVar6];
        if (piVar14[uVar6] < (int)uVar11) {
          uVar5 = uVar11;
        }
        uVar11 = uVar5;
        if (psVar9[uVar6] != psVar9[uVar6 + 1]) {
          iVar8 = piVar2[iVar12] + uVar5;
          uVar11 = 0x80000000;
          iVar10 = -0x80000000;
          if (-1 < (int)(piVar2[iVar12] & uVar5)) {
            iVar10 = iVar8;
          }
          if (iVar8 < 1) {
            iVar10 = iVar8;
          }
          piVar2[iVar12] = iVar10;
        }
      }
    }
  }
  return;
}

Assistant:

void
pl_computePhnHeur(mdef_t * md, ascr_t * a, pl_t * pl, int32 heutype,
                  int32 win_strt, int32 win_efv)
{
    int32 nState;
    int32 i, j;
    int32 curPhn, curFrmPhnVar; /* variables for phoneme lookahead computation */
    int32 *ph_lst;

    nState = mdef_n_emit_state(md);
    ph_lst = pl->phn_heur_list;

    /* Initializing all the phoneme heuristics for each phone to be 0 */
    for (j = 0; j == md->cd2cisen[j]; j++) {
        curPhn = md->sen2cimap[j];      /*Just to save a warning */
        ph_lst[curPhn] = 0;
    }

    /* 20040503: ARCHAN, the code can be reduced to 10 lines, it is so
       organized such that there is no overhead in checking the
       heuristic type in the inner loop.  
     */
    /* One trick we use is to use sen2cimap to check phoneme ending boundary */


    if (heutype == 1) {         /* Taking Max */
        for (i = win_strt; i < win_efv; i++) {
            curPhn = 0;
            curFrmPhnVar = MAX_NEG_INT32;
            for (j = 0; j == md->cd2cisen[j]; j++) {
                if (curFrmPhnVar < a->cache_ci_senscr[i][j])
                    curFrmPhnVar = a->cache_ci_senscr[i][j];

                curPhn = md->sen2cimap[j];
                /* Update at the phone_end boundary */
                if (curPhn != md->sen2cimap[j + 1]) {
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn], curFrmPhnVar);
                    curFrmPhnVar = MAX_NEG_INT32;
                }
            }
        }
    }
    else if (heutype == 2) {
        for (i = win_strt; i < win_efv; i++) {
            curPhn = 0;
            curFrmPhnVar = MAX_NEG_INT32;
            for (j = 0; j == md->cd2cisen[j]; j++) {
                curFrmPhnVar =
                    NO_UFLOW_ADD(a->cache_ci_senscr[i][j], curFrmPhnVar);
                curPhn = md->sen2cimap[j];

                /* Update at the phone_end boundary */
                if (curPhn != md->sen2cimap[j + 1]) {
                    curFrmPhnVar /= nState;     /* ARCHAN: I hate to do division ! */
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn], curFrmPhnVar);
                    curFrmPhnVar = MAX_NEG_INT32;
                }
            }
        }
    }
    else if (heutype == 3) {
        for (i = win_strt; i < win_efv; i++) {
            curPhn = 0;
            curFrmPhnVar = MAX_NEG_INT32;
            for (j = 0; j == md->cd2cisen[j]; j++) {
                if (curPhn == 0 || curPhn != md->sen2cimap[j - 1])      /* dangerous hack! */
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn],
                                     a->cache_ci_senscr[i][j]);

                curPhn = md->sen2cimap[j];

                if (curFrmPhnVar < a->cache_ci_senscr[i][j])
                    curFrmPhnVar = a->cache_ci_senscr[i][j];

                /* Update at the phone_end boundary */
                if (md->sen2cimap[j] != md->sen2cimap[j + 1]) {
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn], curFrmPhnVar);
                    curFrmPhnVar = MAX_NEG_INT32;
                }
            }
        }
    }

#if 0
    for (j = 0; j == md->cd2cisen[j]; j++) {
        curPhn = md->cd2cisen[j];
        E_INFO("phoneme heuristics scores at phn %d is %d\n", j,
               kb->phn_list[mdef->sen2cimap[j]]);
    }
#endif


}